

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_extra.c
# Opt level: O1

void duckdb_je_pa_shard_mtx_stats_read
               (tsdn_t *tsdn,pa_shard_t *shard,mutex_prof_data_t *mutex_prof_data)

{
  pa_shard_mtx_stats_read_single(tsdn,mutex_prof_data,&(shard->edata_cache).mtx,1);
  pa_shard_mtx_stats_read_single(tsdn,mutex_prof_data,&(shard->pac).ecache_dirty.mtx,2);
  pa_shard_mtx_stats_read_single(tsdn,mutex_prof_data,&(shard->pac).ecache_muzzy.mtx,3);
  pa_shard_mtx_stats_read_single(tsdn,mutex_prof_data,&(shard->pac).ecache_retained.mtx,4);
  pa_shard_mtx_stats_read_single(tsdn,mutex_prof_data,&(shard->pac).decay_dirty.mtx,5);
  pa_shard_mtx_stats_read_single(tsdn,mutex_prof_data,&(shard->pac).decay_muzzy.mtx,6);
  if (shard->ever_used_hpa == true) {
    pa_shard_mtx_stats_read_single(tsdn,mutex_prof_data,&(shard->hpa_shard).mtx,9);
    pa_shard_mtx_stats_read_single(tsdn,mutex_prof_data,&(shard->hpa_shard).grow_mtx,10);
    duckdb_je_sec_mutex_stats_read(tsdn,&shard->hpa_sec,mutex_prof_data + 0xb);
    return;
  }
  return;
}

Assistant:

void
pa_shard_mtx_stats_read(tsdn_t *tsdn, pa_shard_t *shard,
    mutex_prof_data_t mutex_prof_data[mutex_prof_num_arena_mutexes]) {
	pa_shard_mtx_stats_read_single(tsdn, mutex_prof_data,
	    &shard->edata_cache.mtx, arena_prof_mutex_extent_avail);
	pa_shard_mtx_stats_read_single(tsdn, mutex_prof_data,
	    &shard->pac.ecache_dirty.mtx, arena_prof_mutex_extents_dirty);
	pa_shard_mtx_stats_read_single(tsdn, mutex_prof_data,
	    &shard->pac.ecache_muzzy.mtx, arena_prof_mutex_extents_muzzy);
	pa_shard_mtx_stats_read_single(tsdn, mutex_prof_data,
	    &shard->pac.ecache_retained.mtx, arena_prof_mutex_extents_retained);
	pa_shard_mtx_stats_read_single(tsdn, mutex_prof_data,
	    &shard->pac.decay_dirty.mtx, arena_prof_mutex_decay_dirty);
	pa_shard_mtx_stats_read_single(tsdn, mutex_prof_data,
	    &shard->pac.decay_muzzy.mtx, arena_prof_mutex_decay_muzzy);

	if (shard->ever_used_hpa) {
		pa_shard_mtx_stats_read_single(tsdn, mutex_prof_data,
		    &shard->hpa_shard.mtx, arena_prof_mutex_hpa_shard);
		pa_shard_mtx_stats_read_single(tsdn, mutex_prof_data,
		    &shard->hpa_shard.grow_mtx,
		    arena_prof_mutex_hpa_shard_grow);
		sec_mutex_stats_read(tsdn, &shard->hpa_sec,
		    &mutex_prof_data[arena_prof_mutex_hpa_sec]);
	}
}